

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall
peach::exception::SyntaxError::SyntaxError(SyntaxError *this,size_t line,size_t position)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SyntaxError",&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"invalid syntax",&local_5a)
  ;
  PositionalError::PositionalError(&this->super_PositionalError,line,position,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_PositionalError).super_PeachException =
       &PTR__PeachException_00141b60;
  return;
}

Assistant:

SyntaxError(std::size_t line,
                std::size_t position)
        : PositionalError(line,
                          position,
                          "SyntaxError", "invalid syntax")
    {
    }